

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static.hpp
# Opt level: O1

int __thiscall
multidim::
MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
::offset(MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
         *this,initializer_list<int> *L)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  if (L->_M_len != 4) {
    __assert_fail("L.size() == Ncount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eruffaldi[P]multidimcxx/multidim_static.hpp"
                  ,0x58,
                  "int multidim::MultiDimNBase<double, multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>>::offset(const std::initializer_list<int> &) const [T = double, TS = multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>]"
                 );
  }
  lVar3 = 0;
  iVar1 = 0;
  do {
    iVar2 = (int)lVar3;
    if (iVar2 == 0) {
      uVar4 = 0x150;
    }
    else {
      uVar4 = (uint)(iVar2 == 0xc);
      if (iVar2 == 8) {
        uVar4 = 8;
      }
      if (iVar2 == 4) {
        uVar4 = 0x38;
      }
    }
    iVar1 = iVar1 + uVar4 * *(int *)((long)L->_M_array + lVar3);
    lVar3 = lVar3 + 4;
  } while ((int)lVar3 != 0x10);
  return iVar1;
}

Assistant:

int offset(const std::initializer_list<int> & L) const 
		{	
			assert(L.size() == Ncount); //,"wrong number of dims");
			auto x = L.begin(); /// C++14 constexpr
			int o = 0;
			for(int i = 0; i < Ncount; x++, i++)
				o += *x *getstep(i);
			return o;
		}